

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week7-app2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x1e);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x3c);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x3c);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0xd2);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    // imperative programming
//    auto u=10;
//    auto v=0;
//    if(v==0)
//        cout << 0 << endl;
//    else
//        cout << u / v << endl;

    // pure functional programming style
//    template<int u, int v> struct Divide        { static const auto value = u / v; };
//    template<int k>        struct Divide<k, 0>  { static const auto value = -1; };
    auto d = Divide<10, 0>::value;
    cout << d << endl;

    cout << Sum2<10, 20>::value << endl;
    cout << Sum2<(Sum2<10, 20>::value), 30>::value << endl;
    cout << Sum3<10, 20, 30>::value << endl;

    cout << Sum<10, 20, 30, 40, 50, 60>::value << endl;

    return 0;
}